

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_1::
multithreadedCreatePerThreadDeviceTest<vkt::api::(anonymous_namespace)::Event>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,Context *context,
          Parameters params)

{
  TestStatus *pTVar1;
  deUint32 dVar2;
  EnvClone *this_00;
  Resources *ptr;
  CreateThread<vkt::api::(anonymous_namespace)::Event> *this_01;
  Parameters *params_00;
  allocator_type *__a;
  allocator_type *__a_00;
  pointer this_02;
  ulong __n;
  pointer this_03;
  bool bVar3;
  Parameters params_local;
  MovePtr<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
  local_f8;
  TestStatus *local_e8;
  Parameters deviceParams;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
  resources;
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  perThreadEnv;
  ThreadGroup threads;
  SharedPtr<vkt::api::(anonymous_namespace)::EnvClone> local_78;
  Environment sharedEnv;
  
  params_00 = (Parameters *)(ulong)params.flags;
  params_local.flags = (VkEventCreateFlags)context;
  local_e8 = __return_storage_ptr__;
  dVar2 = getDefaultTestThreadCount();
  _deviceParams = getDefaulDeviceParameters((Context *)this);
  Environment::Environment(&sharedEnv,(Context *)this,dVar2);
  __n = (ulong)dVar2;
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::vector(&perThreadEnv,__n,__a);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
  ::vector(&resources,__n,__a_00);
  ThreadGroup::ThreadGroup(&threads);
  this_02 = resources.
            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  this_03 = perThreadEnv.
            super__Vector_base<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    pTVar1 = local_e8;
    dVar2 = (deUint32)params_00;
    bVar3 = __n == 0;
    __n = __n - 1;
    if (bVar3) break;
    this_00 = (EnvClone *)operator_new(0x6c0);
    EnvClone::EnvClone(this_00,&sharedEnv,&deviceParams,dVar2);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::SharedPtr(&local_78,this_00);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::operator=(this_03,&local_78);
    de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>::release(&local_78);
    ptr = (Resources *)operator_new(1);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>::SharedPtr
              ((SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources> *)&local_78,ptr);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>::operator=
              (this_02,(SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources> *)&local_78);
    de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>::release
              ((SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources> *)&local_78);
    this_01 = (CreateThread<vkt::api::(anonymous_namespace)::Event> *)operator_new(0x88);
    params_00 = &params_local;
    CreateThread<vkt::api::(anonymous_namespace)::Event>::CreateThread
              (this_01,&this_03->m_ptr->env,this_02->m_ptr,params_00);
    local_f8.
    super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
    .m_data.ptr = (ThreadGroupThread *)this_01;
    ThreadGroup::add(&threads,&local_f8);
    if ((CreateThread<vkt::api::(anonymous_namespace)::Event> *)
        local_f8.
        super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
        .m_data.ptr != (CreateThread<vkt::api::(anonymous_namespace)::Event> *)0x0) {
      (*(((ThreadGroupThread *)
         &(local_f8.
           super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
           .m_data.ptr)->super_Thread)->super_Thread)._vptr_Thread[1])();
      local_f8.
      super_UniqueBase<vkt::api::(anonymous_namespace)::ThreadGroupThread,_de::DefaultDeleter<vkt::api::(anonymous_namespace)::ThreadGroupThread>_>
      .m_data.ptr = (ThreadGroupThread *)0x0;
    }
    this_03 = this_03 + 1;
    this_02 = this_02 + 1;
  }
  ThreadGroup::run(local_e8,&threads);
  ThreadGroup::~ThreadGroup(&threads);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::Event::Resources>_>_>
  ::~vector(&resources);
  std::
  vector<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>,_std::allocator<de::SharedPtr<vkt::api::(anonymous_namespace)::EnvClone>_>_>
  ::~vector(&perThreadEnv);
  return pTVar1;
}

Assistant:

tcu::TestStatus multithreadedCreatePerThreadDeviceTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<EnvClone>						EnvPtr;
	typedef SharedPtr<typename Object::Resources>	ResPtr;

	const deUint32				numThreads		= getDefaultTestThreadCount();
	const Device::Parameters	deviceParams	= getDefaulDeviceParameters(context);
	const Environment			sharedEnv		(context, numThreads);			// For creating Device's
	vector<EnvPtr>				perThreadEnv	(numThreads);
	vector<ResPtr>				resources		(numThreads);
	ThreadGroup					threads;

	for (deUint32 ndx = 0; ndx < numThreads; ndx++)
	{
		perThreadEnv[ndx]	= EnvPtr(new EnvClone(sharedEnv, deviceParams, 1u));
		resources[ndx]		= ResPtr(new typename Object::Resources(perThreadEnv[ndx]->env, params));

		threads.add(MovePtr<ThreadGroupThread>(new CreateThread<Object>(perThreadEnv[ndx]->env, *resources[ndx], params)));
	}

	return threads.run();
}